

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# controlparser.cpp
# Opt level: O3

void __thiscall ControlParser::parseTimeOfDaySetting(ControlParser *this)

{
  int iVar1;
  InputError *pIVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  undefined1 local_70 [8];
  string strTime;
  string strUnits;
  
  strTime._M_dataplus._M_p = (pointer)0x0;
  strTime._M_string_length._0_1_ = 0;
  local_70 = (undefined1  [8])&strTime._M_string_length;
  strTime.field_2._8_8_ = &strUnits._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)((long)&strTime.field_2 + 8),"");
  if (((&this->field_0x20)[*(long *)(*(long *)this + -0x18)] & 2) != 0) {
    pIVar2 = (InputError *)__cxa_allocate_exception(0x30);
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"");
    InputError::InputError(pIVar2,2,&local_90);
    __cxa_throw(pIVar2,&InputError::typeinfo,ENerror::~ENerror);
  }
  std::operator>>((istream *)this,(string *)local_70);
  if (((&this->field_0x20)[*(long *)(*(long *)this + -0x18)] & 2) == 0) {
    std::operator>>((istream *)this,(string *)(strTime.field_2._M_local_buf + 8));
  }
  iVar1 = Utilities::getSeconds((string *)local_70,(string *)((long)&strTime.field_2 + 8));
  this->timeSetting = iVar1;
  if (-1 < iVar1) {
    this->controlType = 3;
    if ((size_type *)strTime.field_2._8_8_ != &strUnits._M_string_length) {
      operator_delete((void *)strTime.field_2._8_8_);
    }
    if (local_70 != (undefined1  [8])&strTime._M_string_length) {
      operator_delete((void *)local_70);
    }
    return;
  }
  pIVar2 = (InputError *)__cxa_allocate_exception(0x30);
  std::operator+(&local_b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70," ");
  std::operator+(&local_d0,&local_b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&strTime.field_2 + 8));
  InputError::InputError(pIVar2,7,&local_d0);
  __cxa_throw(pIVar2,&InputError::typeinfo,ENerror::~ENerror);
}

Assistant:

void ControlParser::parseTimeOfDaySetting()
{
    // ... read time of day
    string strTime;
    string strUnits = "";
    if ( sin.eof() ) throw InputError(InputError::TOO_FEW_ITEMS, "");
    sin >> strTime;
    if ( !sin.eof() ) sin >> strUnits;

    // ... convert time of day to seconds
    timeSetting = Utilities::getSeconds(strTime, strUnits);
    if ( timeSetting < 0 )
    {
        throw InputError(InputError::INVALID_TIME, strTime + " " + strUnits);
    }
    controlType = Control::TIME_OF_DAY;
}